

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_543c74::ConditionalExpr::printLeft(ConditionalExpr *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar1 = this->Cond;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition,") ? (",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  pNVar1 = this->Then;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition,") : (",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  pNVar1 = this->Else;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Cond->print(S);
    S += ") ? (";
    Then->print(S);
    S += ") : (";
    Else->print(S);
    S += ")";
  }